

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O3

size_t io::net::write<io::posix::file,io::net::const_buffer,io::net::transfer_all,void>
                 (file *stream,const_buffer *buffers,error_code *param_3)

{
  ulong uVar1;
  error_category *peVar2;
  size_t sVar3;
  ulong uVar4;
  
  peVar2 = (error_category *)std::_V2::system_category();
  param_3->_M_value = 0;
  param_3->_M_cat = peVar2;
  uVar1 = buffers->size_;
  uVar4 = 0;
  if (uVar1 != 0) {
    do {
      sVar3 = posix::file::write_some(stream,buffers,param_3);
      uVar4 = sVar3 + uVar4;
      if (param_3->_M_value != 0) {
        return uVar4;
      }
    } while (uVar4 < uVar1);
  }
  return uVar4;
}

Assistant:

std::size_t write(SyncWriteStream& stream,
                  const ConstBufferSequence& buffers,
                  CompletionCondition completion_condition,
                  std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_written = 0;
    std::size_t next_write_size = max_single_transfer_size;
    std::size_t buf_size = buffer_size(buffers);

    while (total_bytes_written < buf_size && next_write_size != 0) {
        total_bytes_written += stream.write_some(buffers, ec);
        next_write_size = completion_condition(ec, total_bytes_written);
    }

    return total_bytes_written;
}